

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

bool __thiscall hdc::Logger::enabled(Logger *this,LogKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  switch(kind) {
  case LOG_ERROR:
    goto switchD_00170afd_caseD_0;
  case LOG_INTERNAL_DRIVER:
    if (this->logDriverFlag != false) {
      return true;
    }
    if (kind == LOG_INTERNAL_SYMBOL_TABLE) goto switchD_00170afd_caseD_6;
    if (kind == LOG_INTERNAL_PARSER) goto switchD_00170afd_caseD_5;
    if (kind == LOG_INTERNAL_LEX) goto switchD_00170afd_caseD_4;
    break;
  case LOG_INTERNAL_LEX:
switchD_00170afd_caseD_4:
    if (this->logLexFlag != false) {
      return true;
    }
    if (kind == LOG_INTERNAL_SYMBOL_TABLE) goto switchD_00170afd_caseD_6;
    if (kind == LOG_INTERNAL_PARSER) goto switchD_00170afd_caseD_5;
    break;
  case LOG_INTERNAL_PARSER:
switchD_00170afd_caseD_5:
    if (this->logParserFlag != false) {
      return true;
    }
    if (kind == LOG_INTERNAL_SYMBOL_TABLE) goto switchD_00170afd_caseD_6;
    break;
  case LOG_INTERNAL_SYMBOL_TABLE:
switchD_00170afd_caseD_6:
    if (this->logSymbolTableFlag != false) {
      return true;
    }
  }
  bVar1 = false;
switchD_00170afd_caseD_0:
  return bVar1;
}

Assistant:

bool Logger::enabled(LogKind kind) {
    if (kind == LOG_ERROR) return true;
    if (kind == LOG_INTERNAL_DRIVER && logDriverFlag) return true;
    if (kind == LOG_INTERNAL_LEX && logLexFlag) return true;
    if (kind == LOG_INTERNAL_PARSER && logParserFlag) return true;
    if (kind == LOG_INTERNAL_SYMBOL_TABLE && logSymbolTableFlag) return true;

    return false;
}